

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OricMFMDSK.cpp
# Opt level: O0

void __thiscall Storage::Disk::OricMFMDSK::OricMFMDSK(OricMFMDSK *this,string *file_name)

{
  bool bVar1;
  uint32_t uVar2;
  undefined4 *puVar3;
  string *file_name_local;
  OricMFMDSK *this_local;
  
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__OricMFMDSK_00caa660;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  bVar1 = FileHolder::check_signature(&this->file_,"MFM_DISK",0);
  if (!bVar1) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0xfffffffe;
    __cxa_throw(puVar3,&Error::typeinfo,0);
  }
  uVar2 = FileHolder::get32le(&this->file_);
  this->head_count_ = uVar2;
  uVar2 = FileHolder::get32le(&this->file_);
  this->track_count_ = uVar2;
  uVar2 = FileHolder::get32le(&this->file_);
  this->geometry_type_ = uVar2;
  if ((this->geometry_type_ != 0) && (this->geometry_type_ < 3)) {
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0xfffffffe;
  __cxa_throw(puVar3,&Error::typeinfo,0);
}

Assistant:

OricMFMDSK::OricMFMDSK(const std::string &file_name) :
		file_(file_name) {
	if(!file_.check_signature("MFM_DISK"))
		throw Error::InvalidFormat;

	head_count_ = file_.get32le();
	track_count_ = file_.get32le();
	geometry_type_ = file_.get32le();

	if(geometry_type_ < 1 || geometry_type_ > 2)
		throw Error::InvalidFormat;
}